

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O0

void tommy_trie_inplace_list_insert_tail_not_empty
               (tommy_trie_inplace_node *head,tommy_trie_inplace_node *node)

{
  long lVar1;
  long in_FS_OFFSET;
  tommy_trie_inplace_node *node_local;
  tommy_trie_inplace_node *head_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node->prev = head->prev;
  head->prev = node;
  node->next = (tommy_trie_inplace_node_struct *)0x0;
  node->prev->next = node;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

tommy_inline void tommy_trie_inplace_list_insert_tail_not_empty(tommy_trie_inplace_node* head, tommy_trie_inplace_node* node)
{
	/* insert in the list in the last position */

	/* insert in the "circular" prev list */
	node->prev = head->prev;
	head->prev = node;

	/* insert in the "0 terminated" next list */
	node->next = 0;
	node->prev->next = node;
}